

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::BlockStmt::toString_abi_cxx11_(string *__return_storage_ptr__,BlockStmt *this)

{
  bool bVar1;
  ostream *this_00;
  reference ppSVar2;
  Stmt *stmt;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *__range1;
  ostringstream local_190 [8];
  ostringstream msg;
  BlockStmt *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = std::operator<<((ostream *)local_190,"{");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::begin(&this->Stmts);
  stmt = (Stmt *)std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::end(&this->Stmts);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ast::Stmt_*const_*,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                      (&__end1,(__normal_iterator<ast::Stmt_*const_*,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                                *)&stmt);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<ast::Stmt_*const_*,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
              ::operator*(&__end1);
    ast::operator<<((ostream *)local_190,*ppSVar2);
    std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<ast::Stmt_*const_*,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)local_190,"}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::BlockStmt::toString() const {
    std::ostringstream msg;
    msg << "{" << std::endl;
    for(auto stmt : Stmts){
        msg << stmt;
        msg << std::endl;
    }
    msg << "}";
    return msg.str();
}